

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionCompiler.hpp
# Opt level: O2

bool __thiscall
OpenMD::SelectionCompiler::invalidExpressionToken(SelectionCompiler *this,string *ident)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::operator+(&local_30,"invalid expression token:",ident);
  bVar1 = compileError(this,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return bVar1;
}

Assistant:

bool invalidExpressionToken(const std::string& ident) {
      return compileError("invalid expression token:" + ident);
    }